

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

void __thiscall SQStringTable::Resize(SQStringTable *this,SQInteger size)

{
  SQString **p;
  SQUnsignedInteger SVar1;
  SQUnsignedInteger SVar2;
  SQString *pSVar3;
  SQString **ppSVar4;
  SQUnsignedInteger SVar5;
  SQUnsignedInteger SVar6;
  SQString *pSVar7;
  ulong uVar8;
  
  p = this->_strings;
  SVar1 = this->_numofslots;
  AllocNodes(this,size);
  SVar5 = 0;
  SVar6 = 0;
  if (0 < (long)SVar1) {
    SVar6 = SVar1;
  }
  for (; SVar5 != SVar6; SVar5 = SVar5 + 1) {
    SVar2 = this->_numofslots;
    pSVar7 = p[SVar5];
    while (pSVar7 != (SQString *)0x0) {
      pSVar3 = pSVar7->_next;
      uVar8 = pSVar7->_hash & SVar2 - 1;
      ppSVar4 = this->_strings;
      pSVar7->_next = ppSVar4[uVar8];
      ppSVar4[uVar8] = pSVar7;
      pSVar7 = pSVar3;
    }
  }
  sq_vm_free(p,SVar1 << 3);
  return;
}

Assistant:

void SQStringTable::Resize(SQInteger size)
{
    SQInteger oldsize=_numofslots;
    SQString **oldtable=_strings;
    AllocNodes(size);
    for (SQInteger i=0; i<oldsize; i++){
        SQString *p = oldtable[i];
        while(p){
            SQString *next = p->_next;
            SQHash h = p->_hash&(_numofslots-1);
            p->_next = _strings[h];
            _strings[h] = p;
            p = next;
        }
    }
    SQ_FREE(oldtable,oldsize*sizeof(SQString*));
}